

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

SDKConnection * __thiscall MyClient::OnP2PConnectionStart(MyClient *this,TonkAddress *param_2)

{
  element_type *peVar1;
  MyClient **in_RDI;
  SDKConnection *unaff_retaddr;
  SDKConnectionList<MyP2PClientConnection> *in_stack_00000008;
  shared_ptr<MyP2PClientConnection> shared;
  __shared_ptr<MyP2PClientConnection,_(__gnu_cxx::_Lock_policy)2> local_20 [2];
  
  *(undefined1 *)(in_RDI + 0x11) = 1;
  std::make_shared<MyP2PClientConnection,MyClient*>(in_RDI);
  std::__shared_ptr<MyP2PClientConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
  tonk::SDKConnectionList<MyP2PClientConnection>::Insert(in_stack_00000008,unaff_retaddr);
  peVar1 = std::__shared_ptr<MyP2PClientConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
  std::shared_ptr<MyP2PClientConnection>::~shared_ptr((shared_ptr<MyP2PClientConnection> *)0x10bd79)
  ;
  return &peVar1->super_SDKConnection;
}

Assistant:

tonk::SDKConnection* MyClient::OnP2PConnectionStart(const TonkAddress& /*address*/)
{
    StartedP2PConnection = true;

    auto shared = std::make_shared<MyP2PClientConnection>(this);
    P2PClientList.Insert(shared.get());
    return shared.get();
}